

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nukedopl3.c
# Opt level: O2

void NOPL3_Reset(opl3_chip *chip,uint32_t clock,uint32_t samplerate)

{
  opl3_channel *__s;
  byte bVar1;
  opl3_chip **ppoVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  opl3_slot *poVar6;
  uint uVar7;
  opl3_channel *channel;
  long lVar8;
  
  __s = chip->channel;
  memset(__s,0,0x1170);
  ppoVar2 = &chip->slot[0].chip;
  for (lVar8 = 0; lVar8 != 0x24; lVar8 = lVar8 + 1) {
    *ppoVar2 = chip;
    ppoVar2[2] = (opl3_chip *)&zeromod;
    *(undefined4 *)((long)ppoVar2 + 0x1a) = 0x1ff01ff;
    *(uint8_t *)((long)ppoVar2 + 0x1f) = '\x03';
    ppoVar2[5] = (opl3_chip *)&zeromod;
    *(uint8_t *)((long)ppoVar2 + 0x46) = (uint8_t)lVar8;
    ppoVar2 = ppoVar2 + 10;
  }
  lVar8 = 0;
  channel = __s;
  while( true ) {
    if (lVar8 == 0x12) break;
    bVar1 = ""[lVar8];
    channel->slotz[0] = chip->slot + bVar1;
    poVar6 = chip->slot + bVar1;
    channel->slotz[1] = poVar6 + 3;
    poVar6->channel = channel;
    poVar6[3].channel = channel;
    bVar1 = (char)(((ushort)lVar8 & 0xff) / 9) * -9 + (uint8_t)lVar8;
    iVar3 = 3;
    if ((bVar1 < 3) || (iVar3 = -3, bVar1 < 6)) {
      channel->pair = __s + (uint)(iVar3 + (int)lVar8);
    }
    channel->chip = chip;
    channel->out[0] = &zeromod;
    channel->out[1] = &zeromod;
    channel->out[2] = &zeromod;
    channel->out[3] = &zeromod;
    channel->chtype = '\0';
    channel->cha = 0xffff;
    channel->chb = 0xffff;
    channel->ch_num = (uint8_t)lVar8;
    OPL3_ChannelSetupAlg(channel);
    lVar8 = lVar8 + 1;
    channel = channel + 1;
  }
  chip->noise = 1;
  chip->mixbuff[0] = 0;
  iVar3 = (int)(((ulong)samplerate * 0x48000) / (ulong)clock);
  uVar4 = iVar3 - 0x400;
  uVar7 = -uVar4;
  if (0 < (int)uVar4) {
    uVar7 = uVar4;
  }
  iVar5 = 0x400;
  if (1 < uVar7) {
    iVar5 = iVar3;
  }
  chip->rateratio = iVar5;
  chip->tremoloshift = '\x04';
  chip->vibshift = '\x01';
  chip->address = 0;
  chip->timer = 0;
  chip->tremolo = '\0';
  chip->tremolopos = '\0';
  chip->mixbuff[1] = 0;
  chip->samplecnt = 0;
  chip->oldsamples[0] = 0;
  chip->oldsamples[1] = 0;
  chip->samples[0] = 0;
  chip->samples[1] = 0;
  chip->eg_timer = 0;
  *(undefined4 *)((long)&chip->eg_timer + 7) = 0;
  chip->newm = '\0';
  chip->nts = '\0';
  chip->rhy = '\0';
  chip->vibpos = '\0';
  chip->rm_tc_bit3 = '\0';
  chip->rm_tc_bit5 = '\0';
  chip->rm_hh_bit2 = '\0';
  chip->rm_hh_bit3 = '\0';
  chip->rm_hh_bit7 = '\0';
  chip->rm_hh_bit8 = '\0';
  memset(&chip->writebuf_samplecnt,0,0x4018);
  return;
}

Assistant:

void NOPL3_Reset(opl3_chip *chip, uint32_t clock, uint32_t samplerate)
{
    opl3_slot *slot;
    opl3_channel *channel;
    uint8_t slotnum;
    uint8_t channum;
    uint8_t local_ch_slot;

    //memset(chip, 0, sizeof(opl3_chip));
    memset(chip->channel, 0x00, sizeof(opl3_channel) * 18);
    memset(chip->slot, 0x00, sizeof(opl3_slot) * 36);
    for (slotnum = 0; slotnum < 36; slotnum++)
    {
        slot = &chip->slot[slotnum];
        slot->chip = chip;
        slot->mod = &zeromod;
        slot->eg_rout = 0x1ff;
        slot->eg_out = 0x1ff;
        slot->eg_gen = envelope_gen_num_release;
        slot->trem = (const uint8_t*)&zeromod;
        slot->slot_num = slotnum;
    }
    for (channum = 0; channum < 18; channum++)
    {
        channel = &chip->channel[channum];
        local_ch_slot = ch_slot[channum];
        channel->slotz[0] = &chip->slot[local_ch_slot];
        channel->slotz[1] = &chip->slot[local_ch_slot + 3u];
        chip->slot[local_ch_slot].channel = &chip->channel[channum];
        chip->slot[local_ch_slot + 3u].channel = &chip->channel[channum];
        if ((channum % 9) < 3)
        {
            channel->pair = &chip->channel[channum + 3u];
        }
        else if ((channum % 9) < 6)
        {
            channel->pair = &chip->channel[channum - 3u];
        }
        channel->chip = chip;
        channel->out[0] = &zeromod;
        channel->out[1] = &zeromod;
        channel->out[2] = &zeromod;
        channel->out[3] = &zeromod;
        channel->chtype = ch_2op;
        channel->cha = 0xffff;
        channel->chb = 0xffff;
#if OPL_ENABLE_STEREOEXT
        channel->leftpan = 0x10000;
        channel->rightpan = 0x10000;
#endif
        channel->ch_num = channum;
        OPL3_ChannelSetupAlg(&chip->channel[channum]);
    }
    chip->noise = 1;
    //chip->rateratio = (samplerate << RSM_FRAC) / 49716;
    // ratio: sampleRate / (clock / 288) * (1 << resamplerFraction)
    chip->rateratio = (int32_t)((((uint64_t)288 * samplerate) << RSM_FRAC) / clock);
    if (abs(chip->rateratio - (1 << RSM_FRAC)) <= 1)
        chip->rateratio = (1 << RSM_FRAC);
    chip->tremoloshift = 4;
    chip->vibshift = 1;

#if OPL_ENABLE_STEREOEXT
    if (!panpot_lut_build)
    {
        int32_t i;
        for (i = 0; i < 256; i++)
        {
            panpot_lut[i] = OPL_SIN(i);
        }
        panpot_lut_build = 1;
    }
#endif

    chip->address = 0;
    chip->timer = 0;
    chip->eg_timer = 0;
    chip->eg_timerrem = chip->eg_state = chip->eg_add = 0;
    chip->newm = chip->nts = chip->rhy = chip->tremolo = 0;
    chip->vibpos = chip->tremolopos = 0;
    chip->mixbuff[0] = chip->mixbuff[1] = 0;
    chip->rm_hh_bit2 = chip->rm_hh_bit3 = chip->rm_hh_bit7 = chip->rm_hh_bit8 = 0;
    chip->rm_tc_bit3 = chip->rm_tc_bit5 = 0;

    chip->samplecnt = 0;
    chip->oldsamples[0] = chip->oldsamples[1] = 0;
    chip->samples[0] = chip->samples[1] = 0;
#ifdef NOPL_ENABLE_WRITEBUF
    chip->writebuf_samplecnt = 0;
    chip->writebuf_cur = chip->writebuf_last = 0;
    chip->writebuf_lasttime = 0;
    memset(chip->writebuf, 0x00, sizeof(opl3_writebuf) * OPL_WRITEBUF_SIZE);
#endif
}